

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O0

void qsound_write_data(void *info,UINT8 address,UINT16 data)

{
  int local_2c;
  int pan;
  int reg;
  int ch;
  qsound_state *chip;
  UINT16 data_local;
  UINT8 address_local;
  void *info_local;
  
  pan = 0;
  if (address < 0x80) {
    pan = (int)(uint)address >> 3;
    address = address & 7;
  }
  else if (address < 0x90) {
    pan = address & 0xf;
    address = 8;
  }
  else if ((0xb9 < address) && (address < 0xca)) {
    pan = address - 0xba;
    address = 9;
  }
  switch(address) {
  case '\0':
    *(uint *)((long)info + (long)(int)(pan + 1U & 0xf) * 0x24 + 0x20) = (uint)data << 0x10;
    break;
  case '\x01':
    *(uint *)((long)info + (long)pan * 0x24 + 0x24) = (uint)data;
    break;
  case '\x02':
    *(uint *)((long)info + (long)pan * 0x24 + 0x2c) = (uint)data;
    break;
  case '\x03':
    *(char *)((long)info + (long)pan * 0x24 + 0x32) = (char)((int)(data & 0x8000) >> 0xf);
    *(undefined4 *)((long)info + (long)pan * 0x24 + 0x3c) = 0;
    break;
  case '\x04':
    *(UINT16 *)((long)info + (long)pan * 0x24 + 0x28) = data;
    break;
  case '\x05':
    *(UINT16 *)((long)info + (long)pan * 0x24 + 0x2a) = data;
    break;
  case '\x06':
    *(UINT16 *)((long)info + (long)pan * 0x24 + 0x30) = data;
    break;
  case '\a':
    break;
  case '\b':
    local_2c = (data & 0x3f) - 0x10;
    if (0x20 < local_2c) {
      local_2c = 0x20;
    }
    if (local_2c < 0) {
      local_2c = 0;
    }
    *(undefined4 *)((long)info + (long)pan * 0x24 + 0x38) =
         *(undefined4 *)((long)info + (long)local_2c * 4 + 0x270);
    *(undefined4 *)((long)info + (long)pan * 0x24 + 0x34) =
         *(undefined4 *)((long)info + (long)(0x20 - local_2c) * 4 + 0x270);
    break;
  case '\t':
  }
  return;
}

Assistant:

static void qsound_write_data(void *info, UINT8 address, UINT16 data)
{
	qsound_state *chip = (qsound_state *)info;
	int ch = 0, reg = 0;

	// direct sound reg
	if (address < 0x80)
	{
		ch = address >> 3;
		reg = address & 7;
	}

	// >= 0x80 is probably for the dsp?
	else if (address < 0x90)
	{
		ch = address & 0xf;
		reg = 8;
	}
	else if (address >= 0xba && address < 0xca)
	{
		ch = address - 0xba;
		reg = 9;
	}
	else
	{
		// unknown
		reg = address;
	}

	switch (reg)
	{
		case 0:
			// bank, high bits unknown
			ch = (ch + 1) & 0xf; // strange ...
			chip->channel[ch].bank = data << 16;
			break;

		case 1:
			// start/cur address
			chip->channel[ch].address = data;
			break;

		case 2:
			// frequency
			chip->channel[ch].freq = data;
#if 0
			if (data == 0)
			{
				// key off
				chip->channel[ch].enabled = 0;
			}
#endif
			break;

		case 3:
			// key on (does the value matter? it always writes 0x8000)
			chip->channel[ch].enabled = (data & 0x8000) >> 15;
			chip->channel[ch].step_ptr = 0;
			break;

		case 4:
			// loop address
			chip->channel[ch].loop = data;
			break;

		case 5:
			// end address
			chip->channel[ch].end = data;
			break;

		case 6:
			// master volume
			chip->channel[ch].vol = data;
			break;

		case 7:
			// unused?
			break;

		case 8:
		{
			// panning (left=0x0110, centre=0x0120, right=0x0130)
			// looks like it doesn't write other values than that
			int pan = (data & 0x3f) - 0x10;
			if (pan > 0x20)
				pan = 0x20;
			if (pan < 0)
				pan = 0;
			
			chip->channel[ch].rvol = chip->pan_table[pan];
			chip->channel[ch].lvol = chip->pan_table[0x20 - pan];
			break;
		}

		case 9:
			// unknown
			break;

		default:
			//emu_logf(&chip->logger, DEVLOG_DEBUG, "write_data %02x = %04x\n", address, data);
			break;
	}
}